

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_muls8_x86_64(void *d,void *a,uint64_t b,uint32_t desc)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    *(char *)((long)d + uVar1) = *(char *)((long)a + uVar1) * (char)b;
    uVar1 = uVar1 + 1;
  } while ((desc * 8 & 0xff) + 8 != uVar1);
  if ((desc >> 2 & 0xf8) <= (desc * 8 & 0xff)) {
    return;
  }
  helper_gvec_muls8_x86_64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_muls8)(void *d, void *a, uint64_t b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(uint8_t)) {
        *(uint8_t *)((char *)d + i) = *(uint8_t *)((char *)a + i) * (uint8_t)b;
    }
    clear_high(d, oprsz, desc);
}